

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::PickerPrivate::minimumSizeHint(PickerPrivate *this,QStyleOption *opt)

{
  QArrayData *pQVar1;
  int iVar2;
  int extraout_var;
  QSize QVar3;
  int extraout_var_00;
  QByteArrayView QVar4;
  QArrayData *local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  QVar4.m_data = (storage_type *)0x1;
  QVar4.m_size = (qsizetype)&local_28;
  QString::fromLatin1(QVar4);
  pQVar1 = local_28;
  uStack_18 = 0;
  local_20 = 0;
  local_28 = (QArrayData *)0x0;
  QFontMetrics::boundingRect((QString *)(opt + 0x20));
  this->stringHeight = (extraout_var_00 - extraout_var) + 1;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  iVar2 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar2 * 3;
  this->itemTopMargin = this->stringHeight / 3;
  iVar2 = QFontMetrics::averageCharWidth();
  QVar3.ht = (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin;
  QVar3.wd = (this->minStringLength + 2) * iVar2 + this->itemSideMargin * 2;
  return QVar3;
}

Assistant:

QSize
PickerPrivate::minimumSizeHint( const QStyleOption & opt )
{
	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	itemTopMargin = stringHeight / 3;

	const int minStringWidth = opt.fontMetrics.averageCharWidth() *
		( minStringLength + 2 );
	const int widgetWidth = minStringWidth + 2 * itemSideMargin;
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}